

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall Memory::Recycler::PrintCollectStats(Recycler *this)

{
  size_t sVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  Output::Print(L"Collection Stats:\n");
  PrintHeuristicCollectionStats(this);
  PrintMarkCollectionStats(this);
  PrintBackgroundCollectionStats(this);
  sVar3 = (this->collectionStats).objectSweptBytes;
  lVar6 = (this->collectionStats).objectSweptCount -
          (this->collectionStats).objectSweptFreeListCount;
  sVar4 = (this->collectionStats).objectSweptFreeListBytes;
  Output::Print(
               L"---------------------------------------------------------------------------------------------------------------\n"
               );
  Output::Print(L"Rescan  : %5s %6s %10s | Track   : %5s | ",L"Pages",L"Count",L"Bytes",L"Count");
  Output::Print(L"Sweep     : %7s | SweptObj  : %5s %5s %10s\n",L"Count",L"Count",L"%%",L"Bytes");
  Output::Print(
               L"---------------------------------------------------------------------------------------------------------------\n"
               );
  Output::Print(L"  Small : ");
  Output::Print(L"%5d %6d %10d | ",(this->collectionStats).markData.rescanPageCount,
                (this->collectionStats).markData.rescanObjectCount,
                (this->collectionStats).markData.rescanObjectByteCount);
  Output::Print(L"Process : %5d | ",(this->collectionStats).trackedObjectCount);
  auVar9._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar9._0_8_ = lVar6;
  auVar9._12_4_ = 0x45300000;
  sVar1 = (this->collectionStats).objectSweptCount;
  auVar10._8_4_ = (int)(sVar1 >> 0x20);
  auVar10._0_8_ = sVar1;
  auVar10._12_4_ = 0x45300000;
  Output::Print(L" Scan     : %7d |  Free     : %6d %5.1f %10d\n",
                ((((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0) +
                 (auVar9._8_8_ - 1.9342813113834067e+25)) /
                (((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0) +
                (auVar10._8_8_ - 1.9342813113834067e+25))) * 100.0,
                (this->collectionStats).objectSweepScanCount,lVar6,sVar3 - sVar4);
  Output::Print(L"  Large : ");
  Output::Print(L"%5d %6d %10d | ",(this->collectionStats).markData.rescanLargePageCount,
                (this->collectionStats).markData.rescanLargeObjectCount,
                (this->collectionStats).markData.rescanLargeByteCount);
  Output::Print(L"Client  : %5d | ",(this->collectionStats).clientTrackedObjectCount);
  uVar2 = (this->collectionStats).objectSweptCount;
  uVar5 = (this->collectionStats).objectSweptFreeListCount;
  auVar7._8_8_ = uVar2;
  auVar7._0_8_ = uVar5;
  auVar9 = pblendw((undefined1  [16])0x0,auVar7,0x33);
  Output::Print(L" Finalize : %7d |  Free List: %6d %5.1f %10d\n",
                ((((double)(uVar5 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                 SUB168(auVar9 | _DAT_002f44e0,0)) /
                (((double)(uVar2 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                SUB168(auVar9 | _DAT_002f44e0,8))) * 100.0,
                (this->collectionStats).finalizeSweepCount,uVar5,
                (this->collectionStats).objectSweptFreeListBytes);
  Output::Print(
               L"---------------------------------------------------------------------------------------------------------------\n"
               );
  Output::Print(L"SweptBlk:  Live  Free Total Free%% : Swept Swept%% : CSwpt CSwpt%%");
  if (this->enablePartialCollect == true) {
    Output::Print(L" | Partial    : Count      Bytes     Existing");
  }
  Output::Print(L"\n");
  Output::Print(
               L"---------------------------------------------------------------------------------------------------------------\n"
               );
  PrintHeapBlockStats(this,L"Small",LargeBlockTypeCount);
  if (this->enablePartialCollect == true) {
    sVar1 = (this->collectionStats).smallNonLeafHeapBlockPartialReuseCount[1];
    Output::Print(L" |  Reuse     : %5d %10d %10d",sVar1,
                  (this->collectionStats).smallNonLeafHeapBlockPartialReuseBytes[6],
                  sVar1 * 0x1000 - (this->collectionStats).smallNonLeafHeapBlockPartialReuseBytes[1]
                 );
  }
  Output::Print(L"\n");
  PrintHeapBlockStats(this,L"SmFin",SmallFinalizableBlockType);
  if (this->enablePartialCollect == true) {
    sVar1 = (this->collectionStats).smallNonLeafHeapBlockPartialUnusedCount[3];
    sVar3 = (this->collectionStats).smallNonLeafHeapBlockPartialUnusedBytes[3];
    Output::Print(L" |  Unused    : %5d %10d %10d",sVar1,sVar3,sVar1 * 0x1000 - sVar3);
  }
  Output::Print(L"\n");
  PrintHeapBlockStats(this,L"SmSWB",SmallNormalBlockWithBarrierType);
  if (this->enablePartialCollect == true) {
    sVar1 = (this->collectionStats).smallNonLeafHeapBlockPartialUnusedCount[4];
    sVar3 = (this->collectionStats).smallNonLeafHeapBlockPartialUnusedBytes[4];
    Output::Print(L" |  Unused    : %5d %10d %10d",sVar1,sVar3,sVar1 * 0x1000 - sVar3);
  }
  Output::Print(L"\n");
  PrintHeapBlockStats(this,L"SmFin",MediumAllocBlockTypeCount);
  if (this->enablePartialCollect == true) {
    sVar1 = (this->collectionStats).smallNonLeafHeapBlockPartialUnusedCount[5];
    sVar3 = (this->collectionStats).smallNonLeafHeapBlockPartialUnusedBytes[5];
    Output::Print(L" |  Unused    : %5d %10d %10d",sVar1,sVar3,sVar1 * 0x1000 - sVar3);
  }
  Output::Print(L"\n");
  PrintHeapBlockStats(this,L"SmLeaf",SmallLeafBlockType);
  if (this->enablePartialCollect == true) {
    sVar1 = (this->collectionStats).smallNonLeafHeapBlockPartialReuseCount[3];
    sVar3 = (this->collectionStats).smallNonLeafHeapBlockPartialReuseBytes[3];
    Output::Print(L" |  ReuseFin  : %5d %10d %10d",sVar1,sVar3,sVar1 * 0x1000 - sVar3);
  }
  Output::Print(L"\n");
  PrintHeapBlockStats(this,L"Medium",MediumNormalBlockType);
  if (this->enablePartialCollect == true) {
    sVar1 = (this->collectionStats).smallNonLeafHeapBlockPartialReuseCount[6];
    sVar3 = (this->collectionStats).smallNonLeafHeapBlockPartialReuseBytes[6];
    Output::Print(L" |  Reuse     : %5d %10d %10d",sVar1,sVar3,sVar1 * 0x1000 - sVar3);
  }
  Output::Print(L"\n");
  PrintHeapBlockStats(this,L"MdFin",MediumFinalizableBlockType);
  if (this->enablePartialCollect == true) {
    sVar1 = (this->collectionStats).smallNonLeafHeapBlockPartialUnusedCount[8];
    sVar3 = (this->collectionStats).smallNonLeafHeapBlockPartialUnusedBytes[8];
    Output::Print(L" |  Unused    : %5d %10d %10d",sVar1,sVar3,sVar1 * 0x1000 - sVar3);
  }
  Output::Print(L"\n");
  PrintHeapBlockStats(this,L"MdSWB",MediumNormalBlockWithBarrierType);
  if (this->enablePartialCollect == true) {
    sVar1 = (this->collectionStats).smallNonLeafHeapBlockPartialUnusedCount[9];
    sVar3 = (this->collectionStats).smallNonLeafHeapBlockPartialUnusedBytes[9];
    Output::Print(L" |  Unused    : %5d %10d %10d",sVar1,sVar3,sVar1 * 0x1000 - sVar3);
  }
  Output::Print(L"\n");
  PrintHeapBlockStats(this,L"MdFin",MediumFinalizableBlockWithBarrierType);
  if (this->enablePartialCollect == true) {
    sVar1 = (this->collectionStats).smallNonLeafHeapBlockPartialUnusedCount[10];
    sVar3 = (this->collectionStats).smallNonLeafHeapBlockPartialUnusedBytes[10];
    Output::Print(L" |  Unused    : %5d %10d %10d",sVar1,sVar3,sVar1 * 0x1000 - sVar3);
  }
  Output::Print(L"\n");
  PrintHeapBlockStats(this,L"MdLeaf",MediumNormalBlockType);
  if (this->enablePartialCollect == true) {
    sVar1 = (this->collectionStats).smallNonLeafHeapBlockPartialReuseCount[8];
    sVar3 = (this->collectionStats).smallNonLeafHeapBlockPartialReuseBytes[8];
    Output::Print(L" |  ReuseFin  : %5d %10d %10d",sVar1,sVar3,sVar1 * 0x1000 - sVar3);
  }
  Output::Print(L"\n");
  uVar2 = (this->collectionStats).heapBlockCount[0xb];
  uVar5 = (this->collectionStats).heapBlockFreeCount[0xb];
  auVar8._8_8_ = uVar2;
  auVar8._0_8_ = uVar5;
  auVar9 = pblendw((undefined1  [16])0x0,auVar8,0x33);
  Output::Print(L" %6s : %5d %5d %5d %5.1f",
                ((((double)(uVar5 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                 SUB168(auVar9 | _DAT_002f44e0,0)) /
                (((double)(uVar2 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                SUB168(auVar9 | _DAT_002f44e0,8))) * 100.0,L"Large",uVar2 - uVar5);
  if (this->enablePartialCollect == true) {
    sVar1 = (this->collectionStats).smallNonLeafHeapBlockPartialUnusedCount[3];
    sVar3 = (this->collectionStats).smallNonLeafHeapBlockPartialUnusedBytes[3];
    Output::Print(L"                               |  UnusedFin : %5d %10d %10d",sVar1,sVar3,
                  sVar1 * 0x1000 - sVar3);
  }
  Output::Print(L"\n");
  PrintMemoryStats(this);
  Output::Flush();
  return;
}

Assistant:

void
Recycler::PrintCollectStats()
{
    Output::Print(_u("Collection Stats:\n"));

    PrintHeuristicCollectionStats();
    PrintMarkCollectionStats();
    PrintBackgroundCollectionStats();

    size_t freeCount = collectionStats.objectSweptCount - collectionStats.objectSweptFreeListCount;
    size_t freeBytes = collectionStats.objectSweptBytes - collectionStats.objectSweptFreeListBytes;

    Output::Print(_u("---------------------------------------------------------------------------------------------------------------\n"));
#if ENABLE_PARTIAL_GC || ENABLE_CONCURRENT_GC
    Output::Print(_u("Rescan  : %5s %6s %10s | Track   : %5s | "), _u("Pages"), _u("Count"), _u("Bytes"), _u("Count"));
#endif
    Output::Print(_u("Sweep     : %7s | SweptObj  : %5s %5s %10s\n"), _u("Count"), _u("Count"), _u("%%"), _u("Bytes"));
    Output::Print(_u("---------------------------------------------------------------------------------------------------------------\n"));
    Output::Print(_u("  Small : "));
#if ENABLE_PARTIAL_GC || ENABLE_CONCURRENT_GC
    Output::Print(_u("%5d %6d %10d | "), collectionStats.markData.rescanPageCount, collectionStats.markData.rescanObjectCount, collectionStats.markData.rescanObjectByteCount);
#endif
#if ENABLE_CONCURRENT_GC
    Output::Print(_u("Process : %5d | "), collectionStats.trackedObjectCount);
#else
    Output::Print(_u("              | "));
#endif
    Output::Print(_u(" Scan     : %7d |  Free     : %6d %5.1f %10d\n"),
        collectionStats.objectSweepScanCount,
        freeCount, (double)freeCount / (double) collectionStats.objectSweptCount * 100, freeBytes);

    Output::Print(_u("  Large : "));
#if ENABLE_PARTIAL_GC || ENABLE_CONCURRENT_GC
    Output::Print(_u("%5d %6d %10d | "),
        collectionStats.markData.rescanLargePageCount, collectionStats.markData.rescanLargeObjectCount, collectionStats.markData.rescanLargeByteCount);
#endif
#if ENABLE_PARTIAL_GC
    Output::Print(_u("Client  : %5d | "), collectionStats.clientTrackedObjectCount);
#else
    Output::Print(_u("                | "));
#endif
    Output::Print(_u(" Finalize : %7d |  Free List: %6d %5.1f %10d\n"),
        collectionStats.finalizeSweepCount,
        collectionStats.objectSweptFreeListCount, (double)collectionStats.objectSweptFreeListCount / (double) collectionStats.objectSweptCount * 100, collectionStats.objectSweptFreeListBytes);

    Output::Print(_u("---------------------------------------------------------------------------------------------------------------\n"));
    Output::Print(_u("SweptBlk:  Live  Free Total Free%% : Swept Swept%% : CSwpt CSwpt%%"));
#if ENABLE_PARTIAL_GC
    if (this->enablePartialCollect)
    {
        Output::Print(_u(" | Partial    : Count      Bytes     Existing"));
   }
#endif
    Output::Print(_u("\n"));
    Output::Print(_u("---------------------------------------------------------------------------------------------------------------\n"));

    PrintHeapBlockStats(_u("Small"), HeapBlock::SmallNormalBlockType);
#if ENABLE_PARTIAL_GC
    if (this->enablePartialCollect)
    {
        Output::Print(_u(" |  Reuse     : %5d %10d %10d"),
            collectionStats.smallNonLeafHeapBlockPartialReuseCount[HeapBlock::SmallNormalBlockType],
            collectionStats.smallNonLeafHeapBlockPartialReuseBytes[HeapBlock::MediumNormalBlockType],
            collectionStats.smallNonLeafHeapBlockPartialReuseCount[HeapBlock::SmallNormalBlockType] * AutoSystemInfo::PageSize
            - collectionStats.smallNonLeafHeapBlockPartialReuseBytes[HeapBlock::SmallNormalBlockType]);
    }
#endif
    Output::Print(_u("\n"));
    PrintHeapBlockStats(_u("SmFin"), HeapBlock::SmallFinalizableBlockType);
#if ENABLE_PARTIAL_GC
    if (this->enablePartialCollect)
    {
        Output::Print(_u(" |  Unused    : %5d %10d %10d"),
            collectionStats.smallNonLeafHeapBlockPartialUnusedCount[HeapBlock::SmallFinalizableBlockType],
            collectionStats.smallNonLeafHeapBlockPartialUnusedBytes[HeapBlock::SmallFinalizableBlockType],
            collectionStats.smallNonLeafHeapBlockPartialUnusedCount[HeapBlock::SmallFinalizableBlockType] * AutoSystemInfo::PageSize
                - collectionStats.smallNonLeafHeapBlockPartialUnusedBytes[HeapBlock::SmallFinalizableBlockType]);
    }
#endif
    Output::Print(_u("\n"));

#ifdef RECYCLER_WRITE_BARRIER
    PrintHeapBlockStats(_u("SmSWB"), HeapBlock::SmallNormalBlockWithBarrierType);
#if ENABLE_PARTIAL_GC
    if (this->enablePartialCollect)
    {
        Output::Print(_u(" |  Unused    : %5d %10d %10d"),
            collectionStats.smallNonLeafHeapBlockPartialUnusedCount[HeapBlock::SmallNormalBlockWithBarrierType],
            collectionStats.smallNonLeafHeapBlockPartialUnusedBytes[HeapBlock::SmallNormalBlockWithBarrierType],
            collectionStats.smallNonLeafHeapBlockPartialUnusedCount[HeapBlock::SmallNormalBlockWithBarrierType] * AutoSystemInfo::PageSize
            - collectionStats.smallNonLeafHeapBlockPartialUnusedBytes[HeapBlock::SmallNormalBlockWithBarrierType]);
    }
#endif
    Output::Print(_u("\n"));
    PrintHeapBlockStats(_u("SmFin"), HeapBlock::SmallFinalizableBlockWithBarrierType);
#if ENABLE_PARTIAL_GC
    if (this->enablePartialCollect)
    {
        Output::Print(_u(" |  Unused    : %5d %10d %10d"),
            collectionStats.smallNonLeafHeapBlockPartialUnusedCount[HeapBlock::SmallFinalizableBlockWithBarrierType],
            collectionStats.smallNonLeafHeapBlockPartialUnusedBytes[HeapBlock::SmallFinalizableBlockWithBarrierType],
            collectionStats.smallNonLeafHeapBlockPartialUnusedCount[HeapBlock::SmallFinalizableBlockWithBarrierType] * AutoSystemInfo::PageSize
            - collectionStats.smallNonLeafHeapBlockPartialUnusedBytes[HeapBlock::SmallFinalizableBlockWithBarrierType]);
    }
#endif
    Output::Print(_u("\n"));
#endif

    // TODO: This seems suspicious- why are we looking at smallNonLeaf while print out leaf...
    PrintHeapBlockStats(_u("SmLeaf"), HeapBlock::SmallLeafBlockType);
#if ENABLE_PARTIAL_GC
    if (this->enablePartialCollect)
    {
        Output::Print(_u(" |  ReuseFin  : %5d %10d %10d"),
            collectionStats.smallNonLeafHeapBlockPartialReuseCount[HeapBlock::SmallFinalizableBlockType],
            collectionStats.smallNonLeafHeapBlockPartialReuseBytes[HeapBlock::SmallFinalizableBlockType],
            collectionStats.smallNonLeafHeapBlockPartialReuseCount[HeapBlock::SmallFinalizableBlockType] * AutoSystemInfo::PageSize
                - collectionStats.smallNonLeafHeapBlockPartialReuseBytes[HeapBlock::SmallFinalizableBlockType]);
    }
#endif
    Output::Print(_u("\n"));

    PrintHeapBlockStats(_u("Medium"), HeapBlock::MediumNormalBlockType);
#if ENABLE_PARTIAL_GC
    if (this->enablePartialCollect)
    {
        Output::Print(_u(" |  Reuse     : %5d %10d %10d"),
            collectionStats.smallNonLeafHeapBlockPartialReuseCount[HeapBlock::MediumNormalBlockType],
            collectionStats.smallNonLeafHeapBlockPartialReuseBytes[HeapBlock::MediumNormalBlockType],
            collectionStats.smallNonLeafHeapBlockPartialReuseCount[HeapBlock::MediumNormalBlockType] * AutoSystemInfo::PageSize
            - collectionStats.smallNonLeafHeapBlockPartialReuseBytes[HeapBlock::MediumNormalBlockType]);
    }
#endif
    Output::Print(_u("\n"));
    PrintHeapBlockStats(_u("MdFin"), HeapBlock::MediumFinalizableBlockType);
#if ENABLE_PARTIAL_GC
    if (this->enablePartialCollect)
    {
        Output::Print(_u(" |  Unused    : %5d %10d %10d"),
            collectionStats.smallNonLeafHeapBlockPartialUnusedCount[HeapBlock::MediumFinalizableBlockType],
            collectionStats.smallNonLeafHeapBlockPartialUnusedBytes[HeapBlock::MediumFinalizableBlockType],
            collectionStats.smallNonLeafHeapBlockPartialUnusedCount[HeapBlock::MediumFinalizableBlockType] * AutoSystemInfo::PageSize
            - collectionStats.smallNonLeafHeapBlockPartialUnusedBytes[HeapBlock::MediumFinalizableBlockType]);
    }
#endif
    Output::Print(_u("\n"));

#ifdef RECYCLER_WRITE_BARRIER
    PrintHeapBlockStats(_u("MdSWB"), HeapBlock::MediumNormalBlockWithBarrierType);
#if ENABLE_PARTIAL_GC
    if (this->enablePartialCollect)
    {
        Output::Print(_u(" |  Unused    : %5d %10d %10d"),
            collectionStats.smallNonLeafHeapBlockPartialUnusedCount[HeapBlock::MediumNormalBlockWithBarrierType],
            collectionStats.smallNonLeafHeapBlockPartialUnusedBytes[HeapBlock::MediumNormalBlockWithBarrierType],
            collectionStats.smallNonLeafHeapBlockPartialUnusedCount[HeapBlock::MediumNormalBlockWithBarrierType] * AutoSystemInfo::PageSize
            - collectionStats.smallNonLeafHeapBlockPartialUnusedBytes[HeapBlock::MediumNormalBlockWithBarrierType]);
    }
#endif
    Output::Print(_u("\n"));
    PrintHeapBlockStats(_u("MdFin"), HeapBlock::MediumFinalizableBlockWithBarrierType);
#if ENABLE_PARTIAL_GC
    if (this->enablePartialCollect)
    {
        Output::Print(_u(" |  Unused    : %5d %10d %10d"),
            collectionStats.smallNonLeafHeapBlockPartialUnusedCount[HeapBlock::MediumFinalizableBlockWithBarrierType],
            collectionStats.smallNonLeafHeapBlockPartialUnusedBytes[HeapBlock::MediumFinalizableBlockWithBarrierType],
            collectionStats.smallNonLeafHeapBlockPartialUnusedCount[HeapBlock::MediumFinalizableBlockWithBarrierType] * AutoSystemInfo::PageSize
            - collectionStats.smallNonLeafHeapBlockPartialUnusedBytes[HeapBlock::MediumFinalizableBlockWithBarrierType]);
    }
#endif
    Output::Print(_u("\n"));
#endif

    // TODO: This seems suspicious- why are we looking at smallNonLeaf while print out leaf...
    PrintHeapBlockStats(_u("MdLeaf"), HeapBlock::MediumNormalBlockType);
#if ENABLE_PARTIAL_GC
    if (this->enablePartialCollect)
    {
        Output::Print(_u(" |  ReuseFin  : %5d %10d %10d"),
            collectionStats.smallNonLeafHeapBlockPartialReuseCount[HeapBlock::MediumFinalizableBlockType],
            collectionStats.smallNonLeafHeapBlockPartialReuseBytes[HeapBlock::MediumFinalizableBlockType],
            collectionStats.smallNonLeafHeapBlockPartialReuseCount[HeapBlock::MediumFinalizableBlockType] * AutoSystemInfo::PageSize
            - collectionStats.smallNonLeafHeapBlockPartialReuseBytes[HeapBlock::MediumFinalizableBlockType]);
    }
#endif
    Output::Print(_u("\n"));

    // TODO: This can't possibly be correct...check on this later
    PrintHeapBlockStats(_u("Large"), HeapBlock::LargeBlockType);
#if ENABLE_PARTIAL_GC
    if (this->enablePartialCollect)
    {
        Output::Print(_u("                               |  UnusedFin : %5d %10d %10d"),
            collectionStats.smallNonLeafHeapBlockPartialUnusedCount[HeapBlock::SmallFinalizableBlockType],
            collectionStats.smallNonLeafHeapBlockPartialUnusedBytes[HeapBlock::SmallFinalizableBlockType],
            collectionStats.smallNonLeafHeapBlockPartialUnusedCount[HeapBlock::SmallFinalizableBlockType] * AutoSystemInfo::PageSize
                - collectionStats.smallNonLeafHeapBlockPartialUnusedBytes[HeapBlock::SmallFinalizableBlockType]);
    }
#endif
    Output::Print(_u("\n"));

    PrintMemoryStats();

    Output::Flush();
}